

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall
QComboBoxPrivateContainer::mousePressEvent(QComboBoxPrivateContainer *this,QMouseEvent *e)

{
  QWidget *this_00;
  bool bVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  QStyle *pQVar5;
  ulong uVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  double extraout_XMM0_Qa;
  undefined1 auVar8 [16];
  double extraout_XMM1_Qa;
  undefined1 auVar9 [16];
  QStyleOptionComboBox opt;
  QPoint local_d0;
  QPoint local_c8;
  QStyleOptionComboBox local_c0;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_c0,0xaa,0x90);
  comboStyleOption(&local_c0,this);
  local_c0.super_QStyleOptionComplex.subControls.super_QFlagsStorageHelper<QStyle::SubControl,_4>.
  super_QFlagsStorage<QStyle::SubControl>.i = (QFlagsStorageHelper<QStyle::SubControl,_4>)0xffffffff
  ;
  local_c0.super_QStyleOptionComplex.activeSubControls.
  super_QFlagsStorageHelper<QStyle::SubControl,_4>.super_QFlagsStorage<QStyle::SubControl>.i =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)0x4;
  pQVar5 = QWidget::style(&this->combo->super_QWidget);
  this_00 = &this->combo->super_QWidget;
  uVar2 = QEventPoint::globalPosition();
  auVar9._0_8_ = (double)((ulong)extraout_XMM1_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM1_Qa;
  auVar9._8_8_ = (double)((ulong)extraout_XMM0_Qa & 0x8000000000000000 | 0x3fe0000000000000) +
                 extraout_XMM0_Qa;
  auVar9 = minpd(_DAT_0066f5d0,auVar9);
  auVar8._8_8_ = -(ulong)(-2147483648.0 < auVar9._8_8_);
  auVar8._0_8_ = -(ulong)(-2147483648.0 < auVar9._0_8_);
  uVar3 = movmskpd(uVar2,auVar8);
  uVar7 = 0x8000000000000000;
  if ((uVar3 & 1) != 0) {
    uVar7 = (ulong)(uint)(int)auVar9._0_8_ << 0x20;
  }
  uVar6 = 0x80000000;
  if ((uVar3 & 2) != 0) {
    uVar6 = (ulong)(uint)(int)auVar9._8_8_;
  }
  local_d0 = (QPoint)(uVar6 | uVar7);
  local_c8 = QWidget::mapFromGlobal(this_00,&local_d0);
  iVar4 = (**(code **)(*(long *)pQVar5 + 0xd0))(pQVar5,1,&local_c0,&local_c8,this->combo);
  bVar1 = iVar4 != 4;
  if (*(long *)(*(long *)&(this->combo->super_QWidget).field_0x8 + 0x2a0) == 0) {
    bVar1 = iVar4 == 0;
  }
  if (!bVar1) {
    QWidget::setAttribute((QWidget *)this,WA_NoMouseReplay,true);
  }
  (**(code **)(*(long *)&this->combo->super_QWidget + 0x1b0))();
  QIcon::~QIcon(&local_c0.currentIcon);
  if (&(local_c0.currentText.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
         + -1;
    UNLOCK();
    if (((local_c0.currentText.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
        == 0) {
      QArrayData::deallocate(&(local_c0.currentText.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_c0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivateContainer::mousePressEvent(QMouseEvent *e)
{

    QStyleOptionComboBox opt = comboStyleOption();
    opt.subControls = QStyle::SC_All;
    opt.activeSubControls = QStyle::SC_ComboBoxArrow;
    QStyle::SubControl sc = combo->style()->hitTestComplexControl(QStyle::CC_ComboBox, &opt,
                                                           combo->mapFromGlobal(e->globalPosition().toPoint()),
                                                           combo);
    if ((combo->isEditable() && sc == QStyle::SC_ComboBoxArrow)
        || (!combo->isEditable() && sc != QStyle::SC_None))
        setAttribute(Qt::WA_NoMouseReplay);
    combo->hidePopup();
}